

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::add(Dictionary *this,string *w)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int64_t *piVar2;
  int iVar3;
  pointer pcVar4;
  size_type sVar5;
  element_type *peVar6;
  int32_t iVar7;
  size_type sVar8;
  long lVar9;
  size_type sVar10;
  uint32_t h;
  string_view w_00;
  entry e;
  value_type local_80;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  pcVar4 = (w->_M_dataplus)._M_p;
  sVar5 = w->_M_string_length;
  h = 0x811c9dc5;
  if (sVar5 != 0) {
    sVar8 = 0;
    do {
      h = ((int)pcVar4[sVar8] ^ h) * 0x1000193;
      sVar8 = sVar8 + 1;
    } while (sVar5 != sVar8);
  }
  w_00._M_str = pcVar4;
  w_00._M_len = sVar5;
  iVar7 = find(this,w_00,h);
  this->ntokens_ = this->ntokens_ + 1;
  lVar9 = (long)(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7];
  if (lVar9 == -1) {
    paVar1 = &local_80.word.field_2;
    local_80.word._M_string_length = 0;
    local_80.word.field_2._M_local_buf[0] = '\0';
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_80.word._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_80);
    local_80.count = 1;
    local_38._M_str = (w->_M_dataplus)._M_p;
    local_38._M_len = w->_M_string_length;
    peVar6 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find
                       (&local_38,(peVar6->label)._M_dataplus._M_p,0,
                        (peVar6->label)._M_string_length);
    local_80.type = sVar10 == 0;
    std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
              (&this->words_,&local_80);
    iVar3 = this->size_;
    this->size_ = iVar3 + 1;
    (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar7] = iVar3;
    if (local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.subwords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.word._M_dataplus._M_p != paVar1) {
      operator_delete(local_80.word._M_dataplus._M_p,
                      CONCAT71(local_80.word.field_2._M_allocated_capacity._1_7_,
                               local_80.word.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    piVar2 = &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar9].count;
    *piVar2 = *piVar2 + 1;
  }
  return;
}

Assistant:

void Dictionary::add(const std::string& w) {
  int32_t h = find(w);
  ntokens_++;
  if (word2int_[h] == -1) {
    entry e;
    e.word = w;
    e.count = 1;
    e.type = getType(w);
    words_.push_back(e);
    word2int_[h] = size_++;
  } else {
    words_[word2int_[h]].count++;
  }
}